

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadSceneLibrary(ColladaParser *this)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Node *pNode;
  mapped_type *ppNVar5;
  char *__s;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar2 == '\0') &&
     (iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar2 != '\0')) {
    do {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        if (iVar3 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"visual_scene");
        if (iVar2 == 0) {
          uVar4 = GetAttribute(this,"id");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
          iVar3 = TestAttribute(this,"name");
          __s = "unnamed";
          if (-1 < iVar3) {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])();
            __s = (char *)CONCAT44(extraout_var_02,iVar3);
          }
          pNode = (Node *)operator_new(0x118);
          (pNode->mName)._M_dataplus._M_p = (pointer)&(pNode->mName).field_2;
          (pNode->mName)._M_string_length = 0;
          (pNode->mName).field_2._M_local_buf[0] = '\0';
          (pNode->mID)._M_dataplus._M_p = (pointer)&(pNode->mID).field_2;
          (pNode->mID)._M_string_length = 0;
          (pNode->mID).field_2._M_local_buf[0] = '\0';
          (pNode->mSID)._M_dataplus._M_p = (pointer)&(pNode->mSID).field_2;
          (pNode->mSID)._M_string_length = 0;
          (pNode->mSID).field_2._M_local_buf[0] = '\0';
          memset(&pNode->mParent,0,0x98);
          (pNode->mPrimaryCamera)._M_dataplus._M_p = (pointer)&(pNode->mPrimaryCamera).field_2;
          (pNode->mPrimaryCamera)._M_string_length = 0;
          (pNode->mPrimaryCamera).field_2._M_local_buf[0] = '\0';
          pcVar1 = (char *)(pNode->mID)._M_string_length;
          strlen((char *)CONCAT44(extraout_var_01,iVar2));
          std::__cxx11::string::_M_replace
                    ((ulong)&pNode->mID,0,pcVar1,CONCAT44(extraout_var_01,iVar2));
          pcVar1 = (char *)(pNode->mName)._M_string_length;
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)pNode,0,pcVar1,(ulong)__s);
          ppNVar5 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>_>
                    ::operator[](&this->mNodeLibrary,&pNode->mID);
          *ppNVar5 = pNode;
          ReadSceneNode(this,pNode);
        }
        else {
          SkipElement(this);
        }
      }
      else if (iVar3 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"library_visual_scenes");
        if (iVar2 == 0) {
          return;
        }
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar2 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadSceneLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // a visual scene - generate root node under its ID and let ReadNode() do the recursive work
            if (IsElement("visual_scene"))
            {
                // read ID. Is optional according to the spec, but how on earth should a scene_instance refer to it then?
                int indexID = GetAttribute("id");
                const char* attrID = mReader->getAttributeValue(indexID);

                // read name if given.
                int indexName = TestAttribute("name");
                const char* attrName = "unnamed";
                if (indexName > -1)
                    attrName = mReader->getAttributeValue(indexName);

                // create a node and store it in the library under its ID
                Node* node = new Node;
                node->mID = attrID;
                node->mName = attrName;
                mNodeLibrary[node->mID] = node;

                ReadSceneNode(node);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "library_visual_scenes") == 0)
                //ThrowException( "Expected end of \"library_visual_scenes\" element.");

                break;
        }
    }
}